

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser14.cpp
# Opt level: O3

void __thiscall COLLADASaxFWL::RootParser14::begin__geometry(RootParser14 *this)

{
  geometry__AttributeData *in_RSI;
  
  begin__geometry((RootParser14 *)&this[-1].super_ExtraDataLoader,in_RSI);
  return;
}

Assistant:

bool RootParser14::begin__geometry( const COLLADASaxFWL14::geometry__AttributeData& attributeData )
    {
        SaxVirtualFunctionTest14(begin__geometry(attributeData));
		GeometryLoader* geometryLoader = beginCommonWithId<GeometryLoader, GeometryLoader14>(attributeData.id);
        if ( attributeData.name )
            geometryLoader->setGeometryName (attributeData.name);
        if ( attributeData.id )
            geometryLoader->setGeometryId (attributeData.id);
        return true;
    }